

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_pcg.c
# Opt level: O0

SUNErrCode SUNLinSolSpace_PCG(SUNLinearSolver S,long *lenrwLS,long *leniwLS)

{
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  sunindextype lrw1;
  sunindextype liw1;
  SUNContext sunctx_local_scope_;
  long local_30;
  long local_28;
  long local_20;
  long *local_18;
  long *local_10;
  
  local_20 = in_RDI[2];
  local_18 = in_RDX;
  local_10 = in_RSI;
  N_VSpace(*(undefined8 *)(*in_RDI + 0x50),&local_30,&local_28);
  *local_10 = local_30 * 4 + 1;
  *local_18 = local_28 * 4 + 4;
  return 0;
}

Assistant:

SUNErrCode SUNLinSolSpace_PCG(SUNLinearSolver S, long int* lenrwLS,
                              long int* leniwLS)
{
  SUNFunctionBegin(S->sunctx);
  sunindextype liw1, lrw1;
  N_VSpace(PCG_CONTENT(S)->r, &lrw1, &liw1);
  SUNCheckLastErr();
  *lenrwLS = 1 + lrw1 * 4;
  *leniwLS = 4 + liw1 * 4;
  return SUN_SUCCESS;
}